

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QMenu * __thiscall QToolButton::menu(QToolButton *this)

{
  long lVar1;
  bool bVar2;
  QMenu *pQVar3;
  
  lVar1 = *(long *)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 0x2c8));
  if (bVar2) {
    pQVar3 = QAction::menu<QMenu*>(*(QAction **)(lVar1 + 0x2d0));
    return pQVar3;
  }
  return (QMenu *)0x0;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }